

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

string * __thiscall
relive::ReLiveDB::getConfigValueString
          (string *__return_storage_ptr__,ReLiveDB *this,string *key,string *defaultValue)

{
  pointer pcVar1;
  int iVar2;
  size_type *psVar3;
  pointer *__ptr;
  unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_> kv;
  undefined1 local_58 [24];
  _Invoker_type local_40 [2];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 == 0) {
    storage_abi_cxx11_();
    pcVar1 = (key->_M_dataplus)._M_p;
    local_58._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_58 + 8),pcVar1,pcVar1 + key->_M_string_length);
    sqlite_orm::internal::storage_t<$86c824a$>::
    get_pointer<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ((storage_t<_86c824a_> *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &storage[abi:cxx11]()::_storage_abi_cxx11_);
    if ((_Invoker_type *)local_58._8_8_ != local_40) {
      operator_delete((void *)local_58._8_8_,(ulong)(local_40[0] + 1));
    }
    if ((KeyValue *)local_58._0_8_ == (KeyValue *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar3 = &defaultValue->_M_string_length;
    }
    else {
      defaultValue = (string *)(local_58._0_8_ + 0x20);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar3 = (size_type *)(local_58._0_8_ + 0x28);
    }
    pcVar1 = (defaultValue->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar3);
    if ((KeyValue *)local_58._0_8_ != (KeyValue *)0x0) {
      std::default_delete<relive::KeyValue>::operator()
                ((default_delete<relive::KeyValue> *)local_58,(KeyValue *)local_58._0_8_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::string ReLiveDB::getConfigValueString(const std::string& key, const std::string& defaultValue)
{
    using namespace sqlite_orm;
    std::lock_guard<Mutex> lock{_mutex};
    try {
        if (auto kv = storage().get_pointer<KeyValue>(key)) {
            return kv->value;
        }
        else {
            return defaultValue;
        }
    }
    catch (const std::system_error&) {
        return defaultValue;
    }
}